

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_command_queue_mode_t mode)

{
  char *pcVar1;
  string local_30;
  
  if (mode == ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS) {
    pcVar1 = "ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS";
  }
  else if (mode == ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS) {
    pcVar1 = "ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS";
  }
  else {
    if (mode != ZE_COMMAND_QUEUE_MODE_DEFAULT) {
      std::__cxx11::to_string(&local_30,mode);
      std::operator+(__return_storage_ptr__,"Unknown ze_command_queue_mode_t value: ",&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    pcVar1 = "ZE_COMMAND_QUEUE_MODE_DEFAULT";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_command_queue_mode_t mode) {
  if (mode == ZE_COMMAND_QUEUE_MODE_DEFAULT) {
    return "ZE_COMMAND_QUEUE_MODE_DEFAULT";
  } else if (mode == ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS) {
    return "ZE_COMMAND_QUEUE_MODE_SYNCHRONOUS";
  } else if (mode == ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS) {
    return "ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS";
  } else {
    return "Unknown ze_command_queue_mode_t value: " +
           std::to_string(static_cast<int>(mode));
  }
}